

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_pmull_q_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar29;
  
  auVar7 = _DAT_00d58680;
  auVar6 = _DAT_00d58670;
  uVar12 = desc * 8 & 0xff;
  uVar8 = uVar12 + 8;
  uVar10 = (ulong)uVar8;
  uVar13 = 0;
  do {
    lVar11 = uVar13 + (long)((int)desc >> 10);
    uVar9 = *(ulong *)((long)vn + lVar11 * 8);
    uVar17 = *(ulong *)((long)vm + lVar11 * 8);
    auVar23._8_4_ = (uint)uVar9;
    auVar23._0_8_ = uVar9;
    auVar23._12_4_ = (int)(uVar9 >> 0x20);
    uVar18 = (undefined4)(uVar17 >> 0x20);
    lVar11 = -2;
    auVar27 = ZEXT816(0);
    auVar15 = _DAT_00d6c950;
    uVar20 = -(ulong)((uint)uVar9 & 1) & uVar17;
    uVar22 = 0;
    do {
      uVar21 = uVar22;
      uVar19 = uVar20;
      auVar25 = auVar27;
      lVar29 = auVar15._0_8_;
      auVar26._0_8_ = auVar15._8_8_;
      auVar26._8_4_ = auVar15._8_4_;
      auVar26._12_4_ = auVar15._12_4_;
      uVar4 = -(uVar9 >> lVar29 & 1);
      uVar5 = -(auVar23._8_8_ >> auVar26._0_8_ & 1);
      auVar2._8_4_ = (int)uVar17;
      auVar2._0_8_ = uVar17;
      auVar2._12_4_ = uVar18;
      uVar20 = uVar17 << lVar29 & uVar4 ^ uVar19;
      uVar22 = auVar2._8_8_ << auVar26._8_8_ & uVar5 ^ uVar21;
      auVar3._8_4_ = (int)uVar17;
      auVar3._0_8_ = uVar17;
      auVar3._12_4_ = uVar18;
      auVar27._0_8_ = uVar17 >> 0x40 - lVar29 & uVar4 ^ auVar25._0_8_;
      auVar27._8_8_ = auVar3._8_8_ >> 0x40 - auVar26._0_8_ & uVar5 ^ auVar25._8_8_;
      auVar15._0_8_ = lVar29 + 2;
      auVar15._8_8_ = auVar26._0_8_ + 2;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0x3e);
    auVar14._8_4_ = 0x3e;
    auVar14._0_8_ = 0x3e;
    auVar14._12_4_ = 0;
    auVar15 = (auVar14 | auVar6) ^ auVar7;
    auVar24._0_4_ = -(uint)(auVar15._0_4_ < -0x7fffffc1);
    auVar24._4_4_ = -(uint)(auVar15._0_4_ < -0x7fffffc1);
    auVar24._8_4_ = -(uint)(auVar15._8_4_ < -0x7fffffc1);
    auVar24._12_4_ = -(uint)(auVar15._8_4_ < -0x7fffffc1);
    auVar16._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar24;
    uVar9 = auVar16._0_8_;
    auVar28._0_8_ = auVar27._0_8_ & uVar9;
    uVar17 = auVar16._8_8_;
    auVar28._8_8_ = auVar27._8_8_ & uVar17;
    auVar28 = auVar28 | ~auVar16 & auVar25;
    puVar1 = (ulong *)((long)vd + uVar13 * 8);
    *puVar1 = (~uVar9 & uVar19 | uVar20 & uVar9) ^ (~uVar17 & uVar21 | uVar22 & uVar17);
    puVar1[1] = auVar28._0_8_ ^ auVar28._8_8_;
    uVar13 = uVar13 + 2;
  } while (uVar13 < uVar8 >> 3);
  uVar8 = desc >> 2 & 0xf8;
  if (uVar12 < uVar8) {
    uVar9 = (ulong)(uVar8 + 8);
    uVar13 = uVar10 + 8;
    if (uVar10 + 8 < uVar9) {
      uVar13 = uVar9;
    }
    memset((void *)((long)vd + uVar10),0,(~uVar10 + uVar13 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_pmull_q)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    intptr_t hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; i += 2) {
        uint64_t nn = n[i + hi];
        uint64_t mm = m[i + hi];
        uint64_t rhi = 0;
        uint64_t rlo = 0;

        /* Bit 0 can only influence the low 64-bit result.  */
        if (nn & 1) {
            rlo = mm;
        }

        for (j = 1; j < 64; ++j) {
#ifdef _MSC_VER
            uint64_t mask = 0 - ((nn >> j) & 1);
#else
            uint64_t mask = -((nn >> j) & 1);
#endif
            rlo ^= (mm << j) & mask;
            rhi ^= (mm >> (64 - j)) & mask;
        }
        d[i] = rlo;
        d[i + 1] = rhi;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}